

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::Rips_filtration(Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                  *this,Sparse_distance_matrix<Params> *_dist,dimension_t _dim_max,
                 value_t _threshold,coefficient_t _modulus)

{
  int iVar1;
  overflow_error *this_00;
  undefined7 in_register_00000011;
  
  Sparse_distance_matrix<Params>::Sparse_distance_matrix(&this->dist,_dist);
  iVar1 = (int)(((long)(this->dist).neighbors.
                       super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->dist).neighbors.
                      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  this->n = iVar1;
  if (iVar1 + -2 < (int)CONCAT71(in_register_00000011,_dim_max)) {
    _dim_max = (dimension_t)(iVar1 + -2);
  }
  this->dim_max = _dim_max;
  this->threshold = _threshold;
  this->modulus = _modulus;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::Bitfield_encoding
            (&this->simplex_encoding,iVar1,_dim_max + '\x02');
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar1 = log2up<unsigned_int>(this->modulus - 1);
  this->bits_for_coeff = iVar1;
  if (iVar1 <= (this->simplex_encoding).extra_bits) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error
            (this_00,"Not enough spare bits in the simplex encoding to store a coefficient");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

Rips_filtration(DistanceMatrix&& _dist, dimension_t _dim_max, value_t _threshold, coefficient_t _modulus)
    : dist(std::move(_dist)), n(dist.size()),
    dim_max(std::min<vertex_t>(_dim_max, dist.size() - 2)), threshold(_threshold),
    modulus(_modulus), simplex_encoding(n, dim_max + 2), bits_for_coeff(log2up(modulus-1)) {
      // See entry_with_coeff_t for the logic for log2up(modulus-1) (storing coeff-1)
      if (use_coefficients && simplex_encoding.num_extra_bits() < num_bits_for_coeff())
        // TODO: include relevant numbers in the message
        throw std::overflow_error("Not enough spare bits in the simplex encoding to store a coefficient");
    }